

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsonLibTests_Marshall.c
# Opt level: O0

WJTL_STATUS TestMarshallArrayStrings(void)

{
  WJTL_STATUS WVar1;
  _Bool _result_3;
  _Bool _result_2;
  _Bool _result_1;
  char *pcStack_168;
  _Bool _result;
  char *someStrings [10];
  char *local_110;
  StringStruct theStruct;
  JlMarshallElement marshalStringStruct [2];
  WJTL_STATUS local_c;
  WJTL_STATUS TestReturn;
  
  local_c = WJTL_STATUS_SUCCESS;
  memcpy(&theStruct.StrArrayCount,&DAT_0014f9b0,0xc0);
  memset(&local_110,0,0x38);
  memset(&stack0xfffffffffffffe98,0,0x50);
  WVar1 = MakeJsonAndVerify(&local_110,(JlMarshallElement *)&theStruct.StrArrayCount,2,
                            "{\"ArrayStrFixed\":[],\"StrArray\":[]}");
  WjTestLib_Assert(WVar1 == WJTL_STATUS_SUCCESS,
                   "((JL_STATUS)(MakeJsonAndVerify( &theStruct, marshalStringStruct, ( sizeof(marshalStringStruct) / sizeof((marshalStringStruct)[0]) ), \"{\\\"ArrayStrFixed\\\":[],\\\"StrArray\\\":[]}\" ))) == (JL_STATUS_SUCCESS)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Marshall.c"
                   ,"TestMarshallArrayStrings",0xc4);
  if (WVar1 != WJTL_STATUS_SUCCESS) {
    local_c = WJTL_STATUS_FAILED;
  }
  local_110 = (char *)0x0;
  theStruct.ArrayStrFixed[3] = (char *)0x1;
  theStruct.ArrayStrFixedCount = (size_t)&stack0xfffffffffffffe98;
  theStruct.StrArray = (char **)0x1;
  WVar1 = MakeJsonAndVerify(&local_110,(JlMarshallElement *)&theStruct.StrArrayCount,2,
                            "{\"ArrayStrFixed\":[null],\"StrArray\":[null]}");
  WjTestLib_Assert(WVar1 == WJTL_STATUS_SUCCESS,
                   "((JL_STATUS)(MakeJsonAndVerify( &theStruct, marshalStringStruct, ( sizeof(marshalStringStruct) / sizeof((marshalStringStruct)[0]) ), \"{\\\"ArrayStrFixed\\\":[null],\\\"StrArray\\\":[null]}\" ))) == (JL_STATUS_SUCCESS)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Marshall.c"
                   ,"TestMarshallArrayStrings",0xcd);
  if (WVar1 != WJTL_STATUS_SUCCESS) {
    local_c = WJTL_STATUS_FAILED;
  }
  local_110 = anon_var_dwarf_39d + 10;
  theStruct.ArrayStrFixed[3] = (char *)0x1;
  pcStack_168 = anon_var_dwarf_39d + 10;
  theStruct.ArrayStrFixedCount = (size_t)&stack0xfffffffffffffe98;
  theStruct.StrArray = (char **)0x1;
  WVar1 = MakeJsonAndVerify(&local_110,(JlMarshallElement *)&theStruct.StrArrayCount,2,
                            "{\"ArrayStrFixed\":[null],\"StrArray\":[null]}");
  WjTestLib_Assert(WVar1 == WJTL_STATUS_SUCCESS,
                   "((JL_STATUS)(MakeJsonAndVerify( &theStruct, marshalStringStruct, ( sizeof(marshalStringStruct) / sizeof((marshalStringStruct)[0]) ), \"{\\\"ArrayStrFixed\\\":[null],\\\"StrArray\\\":[null]}\" ))) == (JL_STATUS_SUCCESS)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Marshall.c"
                   ,"TestMarshallArrayStrings",0xd7);
  if (WVar1 != WJTL_STATUS_SUCCESS) {
    local_c = WJTL_STATUS_FAILED;
  }
  local_110 = "a";
  theStruct.ArrayStrFixed[0] = "b";
  theStruct.ArrayStrFixed[1] = "c";
  theStruct.ArrayStrFixed[3] = (char *)0x3;
  pcStack_168 = "A";
  someStrings[0] = "B";
  someStrings[1] = "C";
  theStruct.ArrayStrFixedCount = (size_t)&stack0xfffffffffffffe98;
  theStruct.StrArray = (char **)0x3;
  WVar1 = MakeJsonAndVerify(&local_110,(JlMarshallElement *)&theStruct.StrArrayCount,2,
                            "{\"ArrayStrFixed\":[\"a\",\"b\",\"c\"],\"StrArray\":[\"A\",\"B\",\"C\"]}"
                           );
  WjTestLib_Assert(WVar1 == WJTL_STATUS_SUCCESS,
                   "((JL_STATUS)(MakeJsonAndVerify( &theStruct, marshalStringStruct, ( sizeof(marshalStringStruct) / sizeof((marshalStringStruct)[0]) ), \"{\\\"ArrayStrFixed\\\":[\\\"a\\\",\\\"b\\\",\\\"c\\\"],\\\"StrArray\\\":[\\\"A\\\",\\\"B\\\",\\\"C\\\"]}\" ))) == (JL_STATUS_SUCCESS)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Marshall.c"
                   ,"TestMarshallArrayStrings",0xe5);
  if (WVar1 != WJTL_STATUS_SUCCESS) {
    local_c = WJTL_STATUS_FAILED;
  }
  return local_c;
}

Assistant:

static
WJTL_STATUS
    TestMarshallArrayStrings
    (
        void
    )
{
    WJTL_STATUS TestReturn = WJTL_STATUS_SUCCESS;

    typedef struct
    {
        char* ArrayStrFixed[4];
        size_t ArrayStrFixedCount;
        char** StrArray;
        size_t StrArrayCount;
    } StringStruct;

    JlMarshallElement marshalStringStruct[] =
    {
        JlMarshallStringFixedArray( StringStruct, ArrayStrFixed, ArrayStrFixedCount, "ArrayStrFixed" ),
        JlMarshallStringArray( StringStruct, StrArray, StrArrayCount, "StrArray" ),
    };

    StringStruct theStruct = {{0}};
    char* someStrings[10] = {0};
//    char* jsonString = NULL;

    // Check marshalling empty arrays
    JL_ASSERT_SUCCESS( MakeJsonAndVerify( &theStruct, marshalStringStruct, NumElements(marshalStringStruct),
                                          "{\"ArrayStrFixed\":[],\"StrArray\":[]}" ) );

    // Now try with arrays containing only a single NULL string
    theStruct.ArrayStrFixed[0] = NULL;
    theStruct.ArrayStrFixedCount = 1;
    theStruct.StrArray = someStrings;
    theStruct.StrArrayCount = 1;

    JL_ASSERT_SUCCESS( MakeJsonAndVerify( &theStruct, marshalStringStruct, NumElements(marshalStringStruct),
                                          "{\"ArrayStrFixed\":[null],\"StrArray\":[null]}" ) );

    // Now try with arrays containing only a single empty string
    theStruct.ArrayStrFixed[0] = "";
    theStruct.ArrayStrFixedCount = 1;
    someStrings[0] = "";
    theStruct.StrArray = someStrings;
    theStruct.StrArrayCount = 1;

    JL_ASSERT_SUCCESS( MakeJsonAndVerify( &theStruct, marshalStringStruct, NumElements(marshalStringStruct),
                                          "{\"ArrayStrFixed\":[null],\"StrArray\":[null]}" ) );

    // Now try regular strings
    theStruct.ArrayStrFixed[0] = "a";
    theStruct.ArrayStrFixed[1] = "b";
    theStruct.ArrayStrFixed[2] = "c";
    theStruct.ArrayStrFixedCount = 3;
    someStrings[0] = "A";
    someStrings[1] = "B";
    someStrings[2] = "C";
    theStruct.StrArray = someStrings;
    theStruct.StrArrayCount = 3;

    JL_ASSERT_SUCCESS( MakeJsonAndVerify( &theStruct, marshalStringStruct, NumElements(marshalStringStruct),
                                          "{\"ArrayStrFixed\":[\"a\",\"b\",\"c\"],\"StrArray\":[\"A\",\"B\",\"C\"]}" ) );

    return TestReturn;
}